

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O1

void __thiscall
ps::Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
unsubscribe(Subscriber<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
            *this)

{
  mutex *__mutex;
  _Rb_tree_node_base *p_Var1;
  undefined8 uVar2;
  int iVar3;
  
  __mutex = &this->m;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar3 != 0) {
    uVar2 = std::__throw_system_error(iVar3);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    _Unwind_Resume(uVar2);
  }
  for (p_Var1 = (this->topics)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->topics)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>::
    unsubscribe((Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>
                 *)p_Var1[1]._M_parent,this);
  }
  std::
  _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>,_std::_Select1st<std::pair<const_unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ps::Topic<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>_>_>_>
  ::clear(&(this->topics)._M_t);
  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  return;
}

Assistant:

void unsubscribe()
		{
			std::lock_guard<std::mutex> l{m};
			for (const auto& topic : topics)
				topic.second->unsubscribe(this);
			topics.clear();
		}